

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void __thiscall llvm::DWARFContext::~DWARFContext(DWARFContext *this)

{
  DWARFContext *this_local;
  
  (this->super_DIContext)._vptr_DIContext = (_func_int **)&PTR__DWARFContext_030a36d0;
  std::unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>::
  ~unique_ptr(&this->DObj);
  std::unique_ptr<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>::~unique_ptr
            (&this->RegInfo);
  std::__cxx11::string::~string((string *)&this->DWPName);
  std::weak_ptr<llvm::DWARFContext::DWOFile>::~weak_ptr(&this->DWP);
  StringMap<std::weak_ptr<llvm::DWARFContext::DWOFile>,_llvm::MallocAllocator>::~StringMap
            (&this->DWOFiles);
  std::unique_ptr<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>::~unique_ptr
            (&this->AbbrevDWO);
  DWARFUnitVector::~DWARFUnitVector(&this->DWOUnits);
  std::unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>::
  ~unique_ptr(&this->AppleObjC);
  std::unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>::
  ~unique_ptr(&this->AppleNamespaces);
  std::unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>::
  ~unique_ptr(&this->AppleTypes);
  std::unique_ptr<llvm::AppleAcceleratorTable,_std::default_delete<llvm::AppleAcceleratorTable>_>::
  ~unique_ptr(&this->AppleNames);
  std::unique_ptr<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>::~unique_ptr
            (&this->Names);
  std::unique_ptr<llvm::DWARFDebugMacro,_std::default_delete<llvm::DWARFDebugMacro>_>::~unique_ptr
            (&this->Macro);
  std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::~unique_ptr
            (&this->EHFrame);
  std::unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::~unique_ptr
            (&this->DebugFrame);
  std::unique_ptr<llvm::DWARFDebugLine,_std::default_delete<llvm::DWARFDebugLine>_>::~unique_ptr
            (&this->Line);
  std::unique_ptr<llvm::DWARFDebugAranges,_std::default_delete<llvm::DWARFDebugAranges>_>::
  ~unique_ptr(&this->Aranges);
  std::unique_ptr<llvm::DWARFDebugLoc,_std::default_delete<llvm::DWARFDebugLoc>_>::~unique_ptr
            (&this->Loc);
  std::unique_ptr<llvm::DWARFDebugAbbrev,_std::default_delete<llvm::DWARFDebugAbbrev>_>::~unique_ptr
            (&this->Abbrev);
  std::unique_ptr<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>::~unique_ptr
            (&this->TUIndex);
  std::unique_ptr<llvm::DWARFGdbIndex,_std::default_delete<llvm::DWARFGdbIndex>_>::~unique_ptr
            (&this->GdbIndex);
  std::unique_ptr<llvm::DWARFUnitIndex,_std::default_delete<llvm::DWARFUnitIndex>_>::~unique_ptr
            (&this->CUIndex);
  DWARFUnitVector::~DWARFUnitVector(&this->NormalUnits);
  DIContext::~DIContext(&this->super_DIContext);
  return;
}

Assistant:

DWARFContext::~DWARFContext() = default;